

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp_discovery_peer.cpp
# Opt level: O0

void __thiscall udpdiscovery::impl::PeerEnv::~PeerEnv(PeerEnv *this)

{
  PeerEnv *this_local;
  
  (this->super_PeerEnvInterface)._vptr_PeerEnvInterface = (_func_int **)&PTR__PeerEnv_00115ca0;
  if (this->binding_sock_ != -1) {
    CloseSocket(this->binding_sock_);
  }
  if (this->sock_ != -1) {
    CloseSocket(this->sock_);
  }
  std::__cxx11::list<udpdiscovery::DiscoveredPeer,_std::allocator<udpdiscovery::DiscoveredPeer>_>::
  ~list(&this->discovered_peers_);
  std::__cxx11::string::~string((string *)&this->user_data_);
  MinimalisticMutex::~MinimalisticMutex(&this->lock_);
  PeerEnvInterface::~PeerEnvInterface(&this->super_PeerEnvInterface);
  return;
}

Assistant:

~PeerEnv() {
    if (binding_sock_ != kInvalidSocket) {
      CloseSocket(binding_sock_);
    }

    if (sock_ != kInvalidSocket) {
      CloseSocket(sock_);
    }
  }